

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

void luaD_poscall(lua_State *L,CallInfo *ci,int nres)

{
  l_uint32 *plVar1;
  uint uVar2;
  CallInfo *ci_00;
  long lVar3;
  StkId pSVar4;
  lu_byte lVar5;
  uint uVar6;
  StkId level;
  int wanted;
  TValue *io1;
  
  uVar2 = ci->callstatus;
  if ((L->hookmask != 0) && ((uVar2 >> 0x12 & 1) == 0)) {
    rethook(L,ci,nres);
  }
  level = (ci->func).p;
  uVar6 = uVar2 & 0x400ff;
  wanted = nres;
  if (uVar6 == 0) {
LAB_0010ace4:
    genmoveresults(L,level,nres,wanted);
  }
  else {
    if (uVar6 == 2) {
      if (nres == 0) {
        lVar5 = '\0';
      }
      else {
        pSVar4 = (L->top).p;
        (level->val).value_ = pSVar4[-(long)nres].val.value_;
        lVar5 = *(lu_byte *)((long)pSVar4 + (long)nres * -0x10 + 8);
      }
      (level->val).tt_ = lVar5;
      level = level + 1;
    }
    else if (uVar6 != 1) {
      wanted = (uVar2 & 0xff) - 1;
      if ((uVar2 >> 0x12 & 1) != 0) {
        (L->ci->u2).funcidx = nres;
        plVar1 = &L->ci->callstatus;
        *plVar1 = *plVar1 | 0x20000;
        level = luaF_close(L,level,'\x06',1);
        ci_00 = L->ci;
        plVar1 = &ci_00->callstatus;
        *plVar1 = *plVar1 & 0xfffdffff;
        if (L->hookmask != 0) {
          lVar3 = (L->stack).offset;
          rethook(L,ci_00,nres);
          level = (StkId)(((long)level - lVar3) + (long)(L->stack).p);
        }
        if ((uVar2 & 0xff) == 0) {
          wanted = nres;
        }
      }
      goto LAB_0010ace4;
    }
    (L->top).p = level;
  }
  L->ci = ci->previous;
  return;
}

Assistant:

void luaD_poscall (lua_State *L, CallInfo *ci, int nres) {
  l_uint32 fwanted = ci->callstatus & (CIST_TBC | CIST_NRESULTS);
  if (l_unlikely(L->hookmask) && !(fwanted & CIST_TBC))
    rethook(L, ci, nres);
  /* move results to proper place */
  moveresults(L, ci->func.p, nres, fwanted);
  /* function cannot be in any of these cases when returning */
  lua_assert(!(ci->callstatus &
        (CIST_HOOKED | CIST_YPCALL | CIST_FIN | CIST_CLSRET)));
  L->ci = ci->previous;  /* back to caller (after closing variables) */
}